

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.h
# Opt level: O1

double linalg::uangle<double,4>(vec<double,_4> *a,vec<double,_4> *b)

{
  double __x;
  double dVar1;
  
  dVar1 = a->x * b->x + 0.0 + a->y * b->y + a->z * b->z + a->w * b->w;
  if (1.0 < dVar1) {
    return 0.0;
  }
  __x = -1.0;
  if (-1.0 <= dVar1) {
    __x = dVar1;
  }
  dVar1 = acos(__x);
  return dVar1;
}

Assistant:

constexpr auto operator() (A & a) const -> decltype(a.y) { return a.y; }